

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

int Sfm_TimPriorityNodes(Sfm_Tim_t *p,Vec_Int_t *vCands,int Window)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  uint uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  
  if (100 < (uint)Window) {
    __assert_fail("Window >= 0 && Window <= 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                  ,0x17b,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  Sfm_TimCriticalPath(p,Window);
  iVar7 = (p->vLevels).nSize;
  if (0 < iVar7) {
    lVar5 = 0;
    do {
      pVVar6 = (p->vLevels).pArray;
      iVar9 = pVVar6[lVar5].nSize;
      if (0 < iVar9) {
        lVar8 = 0;
        do {
          iVar7 = pVVar6[lVar5].pArray[lVar8];
          if (((long)iVar7 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar7))
          goto LAB_00536f75;
          pvVar3 = pVVar2->pArray[iVar7];
          if (pvVar3 != (void *)0x0) {
            if ((*(uint *)((long)pvVar3 + 0x14) & 0x40) == 0) {
              __assert_fail("pObj->fMarkC == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                            ,299,"void Sfm_TimUpdateClean(Sfm_Tim_t *)");
            }
            *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf;
            iVar9 = pVVar6[lVar5].nSize;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar9);
        iVar7 = (p->vLevels).nSize;
      }
      pVVar6[lVar5].nSize = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar7);
  }
  iVar9 = (p->vPath).nSize;
  if (0 < iVar9) {
    lVar5 = 0;
    do {
      iVar7 = (p->vPath).pArray[lVar5];
      if (((long)iVar7 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar7)) {
LAB_00536f75:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar2->pArray[iVar7];
      if (pvVar3 != (void *)0x0) {
        uVar10 = *(uint *)((long)pvVar3 + 0x14);
        if ((uVar10 & 0x40) != 0) {
          __assert_fail("pObj->fMarkC == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                        ,0x182,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
        }
        *(uint *)((long)pvVar3 + 0x14) = uVar10 | 0x40;
        uVar10 = uVar10 >> 0xc;
        iVar7 = *(int *)((long)pvVar3 + 0x10);
        iVar9 = (p->vLevels).nSize;
        if (iVar9 <= (int)uVar10) {
          uVar1 = uVar10 + 1;
          uVar4 = iVar9 * 2;
          if ((int)uVar4 <= (int)uVar1) {
            uVar4 = uVar1;
          }
          iVar9 = (p->vLevels).nCap;
          if (iVar9 < (int)uVar4) {
            pVVar6 = (p->vLevels).pArray;
            if (pVVar6 == (Vec_Int_t *)0x0) {
              pVVar6 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
            }
            else {
              pVVar6 = (Vec_Int_t *)realloc(pVVar6,(ulong)uVar4 << 4);
              iVar9 = (p->vLevels).nCap;
            }
            (p->vLevels).pArray = pVVar6;
            memset(pVVar6 + iVar9,0,(long)(int)(uVar4 - iVar9) << 4);
            (p->vLevels).nCap = uVar4;
          }
          (p->vLevels).nSize = uVar1;
        }
        Vec_IntPush((Vec_Int_t *)((long)&((p->vLevels).pArray)->nCap + (ulong)(uVar10 << 4)),iVar7);
        iVar9 = (p->vPath).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar9);
    iVar7 = (p->vLevels).nSize;
  }
  qsort((p->vLevels).pArray,(long)iVar7,0x10,Vec_WecSortCompare1);
  vCands->nSize = 0;
  iVar7 = (p->vLevels).nSize;
  if (iVar7 < 1) {
    uVar10 = 0;
  }
  else {
    lVar5 = 0;
    do {
      pVVar6 = (p->vLevels).pArray;
      iVar9 = pVVar6[lVar5].nSize;
      if (0 < iVar9) {
        lVar8 = 0;
        do {
          iVar7 = pVVar6[lVar5].pArray[lVar8];
          if (((long)iVar7 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar7))
          goto LAB_00536f75;
          pvVar3 = pVVar2->pArray[iVar7];
          if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + 0x14) & 0x10) == 0)) {
            Vec_IntPush(vCands,*(int *)((long)pvVar3 + 0x10));
            iVar9 = pVVar6[lVar5].nSize;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar9);
        iVar7 = (p->vLevels).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar7);
    uVar10 = (uint)(0 < vCands->nSize);
  }
  return uVar10;
}

Assistant:

int Sfm_TimPriorityNodes( Sfm_Tim_t * p, Vec_Int_t * vCands, int Window )
{
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Window >= 0 && Window <= 100 );
    // collect critical path
    Sfm_TimCriticalPath( p, Window );
    // add nodes to the levelized structure
    Sfm_TimUpdateClean( p );
    Abc_NtkForEachObjVec( &p->vPath, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkC == 0 );
        pObj->fMarkC = 1;
        Vec_WecPush( &p->vLevels, Abc_ObjLevel(pObj), Abc_ObjId(pObj) );
    }
    // prioritize nodes by expected gain
    Vec_WecSort( &p->vLevels, 0 );
    Vec_IntClear( vCands );
    Vec_WecForEachLevel( &p->vLevels, vLevel, i )
        Abc_NtkForEachObjVec( vLevel, p->pNtk, pObj, k )
            if ( !pObj->fMarkA )
                Vec_IntPush( vCands, Abc_ObjId(pObj) );
//    printf( "Path = %5d   Cand = %5d\n", Vec_IntSize(&p->vPath) );
    return Vec_IntSize(vCands) > 0;
}